

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threading.cc
# Opt level: O0

vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
* __thiscall
xemmai::t_threading::f_define
          (vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
           *__return_storage_ptr__,t_threading *this)

{
  t_define<xemmai::t_threading> *ptVar1;
  t_object *local_90;
  wstring_view local_88;
  t_object *local_68;
  wstring_view local_60;
  t_define<xemmai::t_threading> local_50;
  t_threading *local_18;
  t_threading *this_local;
  
  local_18 = this;
  this_local = (t_threading *)__return_storage_ptr__;
  t_type_of<std::mutex>::f_define(this);
  t_type_of<std::condition_variable>::f_define(this);
  t_define<xemmai::t_threading>::t_define(&local_50,this);
  local_60 = sv(L"Mutex",5);
  local_68 = t_slot_of::operator_cast_to_t_object_((t_slot_of *)&this->v_type_mutex);
  ptVar1 = t_define<xemmai::t_threading>::operator()(&local_50,local_60,&local_68);
  local_88 = sv(L"Condition",9);
  local_90 = t_slot_of::operator_cast_to_t_object_((t_slot_of *)&this->v_type_condition);
  ptVar1 = t_define<xemmai::t_threading>::operator()(ptVar1,local_88,&local_90);
  t_define::operator_cast_to_vector(__return_storage_ptr__,(t_define *)ptVar1);
  t_define<xemmai::t_threading>::~t_define(&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<t_root, t_rvalue>> t_threading::f_define()
{
	t_type_of<std::mutex>::f_define(this);
	t_type_of<std::condition_variable>::f_define(this);
	return t_define(this)
	(L"Mutex"sv, static_cast<t_object*>(v_type_mutex))
	(L"Condition"sv, static_cast<t_object*>(v_type_condition))
	;
}